

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_discard_redo(nk_text_undo_state *state)

{
  short sVar1;
  long lVar2;
  int local_24;
  int i;
  int n;
  int k;
  nk_size num;
  nk_text_undo_state *state_local;
  
  if (state->redo_point < 99) {
    if (-1 < state->undo_rec[0x62].char_storage) {
      sVar1 = state->undo_rec[0x62].insert_length;
      state->redo_char_point = state->redo_char_point + sVar1;
      nk_memcopy(state->undo_char + (int)state->redo_char_point,
                 (void *)((long)state +
                         (long)(int)sVar1 * -4 + (long)(int)state->redo_char_point * 4 + 0x4a4),
                 (long)(999 - state->redo_char_point));
      for (local_24 = (int)state->redo_point; local_24 < 0x62; local_24 = local_24 + 1) {
        if (-1 < state->undo_rec[local_24].char_storage) {
          state->undo_rec[local_24].char_storage = state->undo_rec[local_24].char_storage + sVar1;
        }
      }
    }
    state->redo_point = state->redo_point + 1;
    lVar2 = (long)(99 - state->redo_point);
    if (lVar2 != 0) {
      nk_memcopy(state->undo_rec + (long)(int)state->redo_point + -1,
                 state->undo_rec + (int)state->redo_point,lVar2 * 0xc);
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_discard_redo(struct nk_text_undo_state *state)
{
/*  discard the oldest entry in the redo list--it's bad if this
    ever happens, but because undo & redo have to store the actual
    characters in different cases, the redo character buffer can
    fill up even though the undo buffer didn't */
    nk_size num;
    int k = NK_TEXTEDIT_UNDOSTATECOUNT-1;
    if (state->redo_point <= k) {
        /* if the k'th undo state has characters, clean those up */
        if (state->undo_rec[k].char_storage >= 0) {
            int n = state->undo_rec[k].insert_length, i;
            /* delete n characters from all other records */
            state->redo_char_point = (short)(state->redo_char_point + n);
            num = (nk_size)(NK_TEXTEDIT_UNDOCHARCOUNT - state->redo_char_point);
            NK_MEMCPY(state->undo_char + state->redo_char_point,
                state->undo_char + state->redo_char_point-n, num * sizeof(char));
            for (i = state->redo_point; i < k; ++i) {
                if (state->undo_rec[i].char_storage >= 0) {
                    state->undo_rec[i].char_storage = (short)
                        (state->undo_rec[i].char_storage + n);
                }
            }
        }
        ++state->redo_point;
        num = (nk_size)(NK_TEXTEDIT_UNDOSTATECOUNT - state->redo_point);
        if (num) NK_MEMCPY(state->undo_rec + state->redo_point-1,
            state->undo_rec + state->redo_point, num * sizeof(state->undo_rec[0]));
    }
}